

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall picojson::default_parse_context::set_bool(default_parse_context *this,bool b)

{
  value local_18;
  
  local_18.type_ = 1;
  local_18.u_.boolean_ = b;
  picojson::value::operator=(this->out_,&local_18);
  picojson::value::~value(&local_18);
  return true;
}

Assistant:

bool set_bool(bool b) {
      *out_ = value(b);
      return true;
    }